

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementHexaCorot_20.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementHexaCorot_20::ShapeFunctions
          (ChElementHexaCorot_20 *this,ShapeVector *N,double r,double s,double t)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 in_register_00001208 [56];
  undefined1 auVar19 [64];
  undefined1 in_register_00001248 [56];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 in_register_00001288 [56];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  
  auVar22._8_56_ = in_register_00001288;
  auVar22._0_8_ = t;
  auVar20._8_56_ = in_register_00001248;
  auVar20._0_8_ = s;
  auVar19._8_56_ = in_register_00001208;
  auVar19._0_8_ = r;
  auVar14 = ZEXT816(0x3ff0000000000000);
  dVar8 = 1.0 - r;
  dVar2 = r + 1.0;
  dVar9 = 1.0 - s;
  dVar3 = s + 1.0;
  dVar10 = 1.0 - t;
  dVar4 = t + 1.0;
  auVar12._8_8_ = 0x8000000000000000;
  auVar12._0_8_ = 0x8000000000000000;
  auVar18 = auVar19._0_16_;
  auVar13 = vxorpd_avx512vl(auVar18,auVar12);
  auVar12 = vfnmadd213sd_fma(auVar18,auVar18,auVar14);
  dVar11 = auVar13._0_8_ - s;
  auVar13 = vfnmadd213sd_fma(auVar20._0_16_,auVar20._0_16_,auVar14);
  auVar21 = auVar22._0_16_;
  auVar18 = vfnmadd231sd_fma(auVar14,auVar21,auVar21);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = dVar9;
  auVar32._8_8_ = 0;
  auVar32._0_8_ = dVar8 * 0.125;
  auVar14 = vmulsd_avx512f(auVar32,auVar17);
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar10;
  auVar15 = vmulsd_avx512f(auVar14,auVar23);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar11;
  auVar16 = vsubsd_avx512f(auVar16,auVar21);
  auVar16 = vaddsd_avx512f(auVar16,ZEXT816(0xc000000000000000));
  auVar15 = vmulsd_avx512f(auVar15,auVar16);
  vmovsd_avx512f(auVar15);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0] =
       (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0]
  ;
  auVar30._8_8_ = 0;
  auVar30._0_8_ = dVar2 * 0.125;
  auVar15 = vmulsd_avx512f(auVar30,auVar17);
  auVar16 = vmulsd_avx512f(auVar15,auVar23);
  auVar26._8_8_ = 0;
  auVar26._0_8_ = r - s;
  auVar17 = vsubsd_avx512f(auVar26,auVar21);
  auVar17 = vaddsd_avx512f(auVar17,ZEXT816(0xc000000000000000));
  auVar16 = vmulsd_avx512f(auVar16,auVar17);
  pdVar1 = (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.
           array + 1;
  vmovsd_avx512f(auVar16);
  *pdVar1 = *pdVar1;
  dVar5 = dVar2 * 0.125 * dVar3;
  auVar24._8_8_ = 0;
  auVar24._0_8_ = dVar10;
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar5;
  auVar16 = vmulsd_avx512f(auVar31,auVar24);
  auVar28._8_8_ = 0;
  auVar28._0_8_ = r + s;
  auVar17 = vsubsd_avx512f(auVar28,auVar21);
  auVar23 = ZEXT816(0xc000000000000000);
  auVar17 = vaddsd_avx512f(auVar17,auVar23);
  auVar16 = vmulsd_avx512f(auVar16,auVar17);
  pdVar1 = (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.
           array + 2;
  vmovsd_avx512f(auVar16);
  *pdVar1 = *pdVar1;
  dVar6 = dVar8 * 0.125 * dVar3;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar6;
  auVar16 = vmulsd_avx512f(auVar33,auVar24);
  auVar29._8_8_ = 0;
  auVar29._0_8_ = s - r;
  auVar17 = vsubsd_avx512f(auVar29,auVar21);
  auVar17 = vaddsd_avx512f(auVar17,auVar23);
  auVar16 = vmulsd_avx512f(auVar16,auVar17);
  pdVar1 = (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.
           array + 3;
  vmovsd_avx512f(auVar16);
  *pdVar1 = *pdVar1;
  auVar21._8_8_ = 0;
  auVar21._0_8_ = dVar4;
  auVar14 = vmulsd_avx512f(auVar14,auVar21);
  auVar25._8_8_ = 0;
  auVar25._0_8_ = dVar11 + t;
  auVar16 = vaddsd_avx512f(auVar25,auVar23);
  auVar14 = vmulsd_avx512f(auVar14,auVar16);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[4] =
       auVar14._0_8_;
  auVar14 = vmulsd_avx512f(auVar15,auVar21);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = (r - s) + t;
  auVar15 = vaddsd_avx512f(auVar15,auVar23);
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[5] =
       auVar14._0_8_ * auVar15._0_8_;
  auVar27._8_8_ = 0;
  auVar27._0_8_ = r + s + t;
  auVar14 = vaddsd_avx512f(auVar27,ZEXT816(0xc000000000000000));
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[6] =
       dVar5 * dVar4 * auVar14._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = (s - r) + t;
  auVar14 = vaddsd_avx512f(auVar14,ZEXT816(0xc000000000000000));
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[7] =
       dVar6 * dVar4 * auVar14._0_8_;
  dVar11 = auVar12._0_8_ * 0.25;
  dVar5 = dVar11 * dVar9;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[8] =
       dVar5 * dVar10;
  dVar7 = auVar13._0_8_ * 0.25;
  dVar6 = dVar2 * dVar7;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[9] =
       dVar10 * dVar6;
  dVar11 = dVar11 * dVar3;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[10] =
       dVar10 * dVar11;
  dVar7 = dVar8 * dVar7;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0xb] =
       dVar10 * dVar7;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0xc] =
       dVar5 * dVar4;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0xd] =
       dVar4 * dVar6;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0xe] =
       dVar4 * dVar11;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0xf] =
       dVar4 * dVar7;
  dVar4 = auVar18._0_8_ * 0.25;
  dVar8 = dVar8 * dVar4;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0x10] =
       dVar9 * dVar8;
  dVar2 = dVar2 * dVar4;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0x11] =
       dVar9 * dVar2;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0x12] =
       dVar3 * dVar2;
  (N->super_PlainObjectBase<Eigen::Matrix<double,_1,_20,_1,_1,_20>_>).m_storage.m_data.array[0x13] =
       dVar3 * dVar8;
  return;
}

Assistant:

void ChElementHexaCorot_20::ShapeFunctions(ShapeVector& N, double r, double s, double t) {
    double rm = 1.0 - r;
    double rp = 1.0 + r;
    double sm = 1.0 - s;
    double sp = 1.0 + s;
    double tm = 1.0 - t;
    double tp = 1.0 + t;
    double r2 = 1.0 - r * r;
    double s2 = 1.0 - s * s;
    double t2 = 1.0 - t * t;

    // The eight corner points
    N(0) = 0.125 * rm * sm * tm * (-r - s - t - 2.0);
    N(1) = 0.125 * rp * sm * tm * (r - s - t - 2.0);
    N(2) = 0.125 * rp * sp * tm * (r + s - t - 2.0);
    N(3) = 0.125 * rm * sp * tm * (-r + s - t - 2.0);
    N(4) = 0.125 * rm * sm * tp * (-r - s + t - 2.0);
    N(5) = 0.125 * rp * sm * tp * (r - s + t - 2.0);
    N(6) = 0.125 * rp * sp * tp * (r + s + t - 2.0);
    N(7) = 0.125 * rm * sp * tp * (-r + s + t - 2.0);

    // The mid-edge nodes
    N(8) = 0.25 * r2 * sm * tm;
    N(9) = 0.25 * s2 * rp * tm;
    N(10) = 0.25 * r2 * sp * tm;
    N(11) = 0.25 * s2 * rm * tm;
    N(12) = 0.25 * r2 * sm * tp;
    N(13) = 0.25 * s2 * rp * tp;
    N(14) = 0.25 * r2 * sp * tp;
    N(15) = 0.25 * s2 * rm * tp;
    N(16) = 0.25 * t2 * rm * sm;
    N(17) = 0.25 * t2 * rp * sm;
    N(18) = 0.25 * t2 * rp * sp;
    N(19) = 0.25 * t2 * rm * sp;
}